

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

void __thiscall Board::StaticInit::StaticInit(StaticInit *this)

{
  bool bVar1;
  int iVar2;
  ResourceBase *pRVar3;
  undefined4 extraout_var;
  DebugScreen *pDVar4;
  undefined4 extraout_var_00;
  path *in_RCX;
  uint tileWidth;
  uint tileWidth_00;
  format_string_t<const_ghc::filesystem::path_&> fmt;
  format_string_t<const_ghc::filesystem::path_&> fmt_00;
  allocator local_81;
  string local_80;
  path local_60;
  path local_40;
  
  spdlog::debug<char[32]>((char (*) [32])"Board::StaticInit initializing.");
  pRVar3 = Locator::getResource();
  ghc::filesystem::path::path<char[30],ghc::filesystem::path>
            (&local_40,(char (*) [30])"resources/texturePackGrid.png",auto_format);
  ghc::filesystem::path::path<char[32],ghc::filesystem::path>
            (&local_60,(char (*) [32])"resources/texturePackNoGrid.png",auto_format);
  iVar2 = (*pRVar3->_vptr_ResourceBase[2])(pRVar3,&local_40,1);
  this->tilesetGrid = (Texture *)CONCAT44(extraout_var,iVar2);
  anon_unknown.dwarf_8e89f::loadTileset(&local_40,(Texture *)CONCAT44(extraout_var,iVar2),tileWidth)
  ;
  sf::Texture::setSmooth(this->tilesetGrid,true);
  bVar1 = sf::Texture::generateMipmap(this->tilesetGrid);
  if (!bVar1) {
    fmt.str.size_ = (size_t)&local_40;
    fmt.str.data_ = (char *)0x2c;
    spdlog::warn<ghc::filesystem::path_const&>
              ((spdlog *)"\"{}\": Unable to generate mipmap for texture.",fmt,in_RCX);
  }
  pDVar4 = DebugScreen::instance();
  std::__cxx11::string::string((string *)&local_80,"tilesetGrid",&local_81);
  DebugScreen::registerTexture(pDVar4,&local_80,this->tilesetGrid);
  std::__cxx11::string::~string((string *)&local_80);
  iVar2 = (*pRVar3->_vptr_ResourceBase[2])(pRVar3,&local_60,1);
  this->tilesetNoGrid = (Texture *)CONCAT44(extraout_var_00,iVar2);
  anon_unknown.dwarf_8e89f::loadTileset
            (&local_60,(Texture *)CONCAT44(extraout_var_00,iVar2),tileWidth_00);
  sf::Texture::setSmooth(this->tilesetNoGrid,true);
  bVar1 = sf::Texture::generateMipmap(this->tilesetNoGrid);
  if (!bVar1) {
    fmt_00.str.size_ = (size_t)&local_60;
    fmt_00.str.data_ = (char *)0x2c;
    spdlog::warn<ghc::filesystem::path_const&>
              ((spdlog *)"\"{}\": Unable to generate mipmap for texture.",fmt_00,in_RCX);
  }
  pDVar4 = DebugScreen::instance();
  std::__cxx11::string::string((string *)&local_80,"tilesetNoGrid",&local_81);
  DebugScreen::registerTexture(pDVar4,&local_80,this->tilesetNoGrid);
  std::__cxx11::string::~string((string *)&local_80);
  ghc::filesystem::path::~path(&local_60);
  ghc::filesystem::path::~path(&local_40);
  return;
}

Assistant:

Board::StaticInit::StaticInit() {
    spdlog::debug("Board::StaticInit initializing.");
    ResourceBase* resource = Locator::getResource();
    const fs::path& filenameGrid = "resources/texturePackGrid.png";
    const fs::path& filenameNoGrid = "resources/texturePackNoGrid.png";

    tilesetGrid = &resource->getTexture(filenameGrid, true);
    loadTileset(filenameGrid, tilesetGrid, TileWidth::TEXELS);
    tilesetGrid->setSmooth(true);
    if (!tilesetGrid->generateMipmap()) {
        spdlog::warn("\"{}\": Unable to generate mipmap for texture.", filenameGrid);
    }
    DebugScreen::instance()->registerTexture("tilesetGrid", tilesetGrid);

    tilesetNoGrid = &resource->getTexture(filenameNoGrid, true);
    loadTileset(filenameNoGrid, tilesetNoGrid, TileWidth::TEXELS);
    tilesetNoGrid->setSmooth(true);
    if (!tilesetNoGrid->generateMipmap()) {
        spdlog::warn("\"{}\": Unable to generate mipmap for texture.", filenameNoGrid);
    }
    DebugScreen::instance()->registerTexture("tilesetNoGrid", tilesetNoGrid);
}